

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::ClipperBase::Clear(ClipperBase *this)

{
  LocalMinima *pLVar1;
  LocalMinima *pLVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  ulong uVar5;
  
  pLVar2 = this->m_MinimaList;
  while (pLVar2 != (LocalMinima *)0x0) {
    pLVar1 = pLVar2->next;
    operator_delete(pLVar2);
    this->m_MinimaList = pLVar1;
    pLVar2 = pLVar1;
  }
  this->m_CurrentLM = (LocalMinima *)0x0;
  ppTVar3 = (this->m_edges).
            super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar4 = (this->m_edges).
            super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar4 != ppTVar3) {
    uVar5 = 0;
    do {
      if (ppTVar3[uVar5] != (TEdge *)0x0) {
        operator_delete__(ppTVar3[uVar5]);
      }
      uVar5 = uVar5 + 1;
      ppTVar3 = (this->m_edges).
                super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar4 = (this->m_edges).
                super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar5 < (ulong)((long)ppTVar4 - (long)ppTVar3 >> 3));
  }
  if (ppTVar4 != ppTVar3) {
    (this->m_edges).super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar3;
  }
  this->m_UseFullRange = false;
  return;
}

Assistant:

void ClipperBase::Clear()
{
  DisposeLocalMinimaList();
  for (EdgeList::size_type i = 0; i < m_edges.size(); ++i) delete [] m_edges[i];
  m_edges.clear();
  m_UseFullRange = false;
}